

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynarray.c
# Opt level: O0

size_t sysbvm_dynarray_addAll(sysbvm_dynarray_t *dynarray,size_t entryCount,void *newEntries)

{
  uint8_t *puVar1;
  uint8_t *newStorage;
  size_t newCapacity;
  size_t requiredCapacity;
  void *newEntries_local;
  size_t entryCount_local;
  sysbvm_dynarray_t *dynarray_local;
  
  puVar1 = (uint8_t *)(dynarray->size + entryCount);
  if ((uint8_t *)dynarray->capacity < puVar1) {
    newStorage = (uint8_t *)dynarray->capacity;
    if (newStorage < (uint8_t *)0x10) {
      newStorage = (uint8_t *)0x10;
    }
    for (; newStorage < puVar1; newStorage = (uint8_t *)((long)newStorage << 1)) {
    }
    puVar1 = (uint8_t *)malloc(dynarray->entrySize * (long)newStorage);
    memcpy(puVar1,dynarray->data,dynarray->entrySize * dynarray->size);
    free(dynarray->data);
    dynarray->capacity = (size_t)newStorage;
    dynarray->data = puVar1;
  }
  memcpy(dynarray->data + dynarray->size * dynarray->entrySize,newEntries,
         entryCount * dynarray->entrySize);
  dynarray->size = entryCount + dynarray->size;
  return dynarray->size;
}

Assistant:

size_t sysbvm_dynarray_addAll(sysbvm_dynarray_t *dynarray, size_t entryCount, const void *newEntries)
{
    size_t requiredCapacity = dynarray->size + entryCount;
    if(requiredCapacity > dynarray->capacity)
    {
        size_t newCapacity = dynarray->capacity;
        if(newCapacity < 16)
            newCapacity = 16;

        while(newCapacity < requiredCapacity)
            newCapacity *= 2;

        uint8_t *newStorage = (uint8_t*)malloc(dynarray->entrySize * newCapacity);
        memcpy(newStorage, dynarray->data, dynarray->entrySize * dynarray->size);
        free(dynarray->data);

        dynarray->capacity = newCapacity;
        dynarray->data = newStorage;
    }

    memcpy(dynarray->data + dynarray->size*dynarray->entrySize, newEntries, entryCount*dynarray->entrySize);
    dynarray->size += entryCount;
    return dynarray->size;
}